

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O1

int __thiscall
Centaurus::CATNMachine<unsigned_char>::import_literal_terminal
          (CATNMachine<unsigned_char> *this,
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          *literal,int origin,int tag)

{
  byte bVar1;
  size_type sVar2;
  pointer puVar3;
  size_type sVar4;
  CharClass<unsigned_char> local_50;
  
  sVar2 = literal->_M_string_length;
  if (sVar2 != 0) {
    puVar3 = (literal->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      bVar1 = puVar3[sVar4];
      CharClass<unsigned_char>::CharClass(&local_50,(uint)bVar1,(uint)bVar1 + L'\x01');
      origin = add_node(this,&local_50,origin,tag);
      local_50._vptr_CharClass = (_func_int **)&PTR__CharClass_0019f4d8;
      std::
      vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
      ~vector(&local_50.m_ranges);
      sVar4 = sVar4 + 1;
      tag = 0;
    } while (sVar2 != sVar4);
  }
  return origin;
}

Assistant:

int import_literal_terminal(const std::basic_string<TCHAR>& literal, int origin, int tag)
    {
        for (TCHAR ch : literal)
        {
            origin = add_node(CharClass<TCHAR>(ch, ch + 1), origin, tag);
            tag = 0;
        }
        return origin;
    }